

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.cpp
# Opt level: O0

void check_variant_value<type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>,int>
               (basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *var,
               int *val)

{
  bool bVar1;
  int *lhs;
  union_type<debugger_type> local_5e9;
  basic_optional<type_safe::reference_optional_storage<const_debugger_type,_false>_> local_5e8;
  Decomposer local_5da;
  ExprLhs<bool> local_5d9;
  BinaryExpr<bool,_bool> local_5d8;
  StringRef local_5b0;
  SourceLineInfo local_5a0;
  StringRef local_590;
  undefined1 local_580 [8];
  AssertionHandler catchAssertionHandler_8;
  basic_optional<type_safe::reference_optional_storage<const_double,_false>_> local_530;
  Decomposer local_522;
  ExprLhs<bool> local_521;
  BinaryExpr<bool,_bool> local_520;
  StringRef local_4f8;
  SourceLineInfo local_4e8;
  StringRef local_4d8;
  undefined1 local_4c8 [8];
  AssertionHandler catchAssertionHandler_7;
  basic_optional<type_safe::reference_optional_storage<const_int,_false>_> local_478;
  Decomposer local_46a;
  ExprLhs<bool> local_469;
  BinaryExpr<bool,_bool> local_468;
  StringRef local_440;
  SourceLineInfo local_430;
  StringRef local_420;
  undefined1 local_410 [8];
  AssertionHandler catchAssertionHandler_6;
  basic_optional<type_safe::reference_optional_storage<const_type_safe::nullvar_t,_false>_>
  local_3c0;
  Decomposer local_3b2;
  ExprLhs<bool> local_3b1;
  StringRef local_3b0;
  SourceLineInfo local_3a0;
  StringRef local_390;
  undefined1 local_380 [8];
  AssertionHandler catchAssertionHandler_5;
  int *local_330;
  BinaryExpr<const_int_&,_const_int_&> local_328;
  StringRef local_2f8;
  SourceLineInfo local_2e8;
  StringRef local_2d8;
  undefined1 local_2c8 [8];
  AssertionHandler catchAssertionHandler_4;
  StringRef local_278;
  SourceLineInfo local_268;
  StringRef local_258;
  undefined1 local_248 [8];
  AssertionHandler catchAssertionHandler_3;
  type_id local_1f8;
  type_id local_1f0;
  Decomposer local_1e1;
  type_id *local_1e0;
  BinaryExpr<const_type_safe::tagged_union<int,_double,_debugger_type>::type_id_&,_const_type_safe::tagged_union<int,_double,_debugger_type>::type_id_&>
  local_1d8;
  StringRef local_1a8;
  SourceLineInfo local_198;
  StringRef local_188;
  undefined1 local_178 [8];
  AssertionHandler catchAssertionHandler_2;
  ExprLhs<const_type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_&>
  local_128;
  StringRef local_120;
  SourceLineInfo local_110;
  StringRef local_100;
  undefined1 local_f0 [8];
  AssertionHandler catchAssertionHandler_1;
  Decomposer local_92;
  ExprLhs<bool> local_91;
  StringRef local_90;
  SourceLineInfo local_80;
  StringRef local_70;
  undefined1 local_60 [8];
  AssertionHandler catchAssertionHandler;
  int *val_local;
  basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *var_local;
  
  catchAssertionHandler.m_resultCapture = (IResultCapture *)val;
  local_70 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp"
             ,0x31);
  Catch::StringRef::StringRef(&local_90,"var.has_value()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_60,&local_70,&local_80,local_90,Normal);
  bVar1 = type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>::
          has_value(var);
  local_91 = Catch::Decomposer::operator<=(&local_92,bVar1);
  Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_60,&local_91);
  Catch::AssertionHandler::complete((AssertionHandler *)local_60);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_60);
  local_100 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp"
             ,0x32);
  Catch::StringRef::StringRef(&local_120,"var");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_f0,&local_100,&local_110,local_120,Normal);
  local_128 = Catch::Decomposer::operator<=
                        ((Decomposer *)((long)&catchAssertionHandler_2.m_resultCapture + 7),var);
  Catch::AssertionHandler::
  handleExpr<type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>const&>
            ((AssertionHandler *)local_f0,&local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)local_f0);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_f0);
  local_188 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_198,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp"
             ,0x35);
  Catch::StringRef::StringRef
            (&local_1a8,"var.type() == typename Variant::type_id(variant_type<T>{})");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,&local_188,&local_198,local_1a8,Normal);
  local_1f0.
  super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>.
  value_ = (strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
            )type_safe::
             basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>::type
                       (var);
  local_1e0 = (type_id *)Catch::Decomposer::operator<=(&local_1e1,&local_1f0);
  type_safe::union_type<int>::union_type
            ((union_type<int> *)((long)&catchAssertionHandler_3.m_resultCapture + 7));
  type_safe::tagged_union<int,_double,_debugger_type>::type_id::type_id<int>();
  Catch::ExprLhs<type_safe::tagged_union<int,double,debugger_type>::type_id_const&>::operator==
            (&local_1d8,
             (ExprLhs<type_safe::tagged_union<int,double,debugger_type>::type_id_const&> *)
             &local_1e0,&local_1f8);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,&local_1d8.super_ITransientExpression);
  Catch::
  BinaryExpr<const_type_safe::tagged_union<int,_double,_debugger_type>::type_id_&,_const_type_safe::tagged_union<int,_double,_debugger_type>::type_id_&>
  ::~BinaryExpr(&local_1d8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_178);
  local_258 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_268,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp"
             ,0x36);
  Catch::StringRef::StringRef(&local_278,"var.has_value(variant_type<T>{})");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_248,&local_258,&local_268,local_278,Normal);
  type_safe::union_type<int>::union_type
            ((union_type<int> *)((long)&catchAssertionHandler_4.m_resultCapture + 5));
  bVar1 = type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>::
          has_value<int>(var);
  catchAssertionHandler_4.m_resultCapture._7_1_ =
       Catch::Decomposer::operator<=
                 ((Decomposer *)((long)&catchAssertionHandler_4.m_resultCapture + 6),bVar1);
  Catch::AssertionHandler::handleExpr<bool>
            ((AssertionHandler *)local_248,
             (ExprLhs<bool> *)((long)&catchAssertionHandler_4.m_resultCapture + 7));
  Catch::AssertionHandler::complete((AssertionHandler *)local_248);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_248);
  local_2d8 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_2e8,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp"
             ,0x39);
  Catch::StringRef::StringRef(&local_2f8,"var.value(variant_type<T>{}) == val");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_2c8,&local_2d8,&local_2e8,local_2f8,Normal);
  type_safe::union_type<int>::union_type
            ((union_type<int> *)((long)&catchAssertionHandler_5.m_resultCapture + 6));
  lhs = type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>::
        value<int,void>((basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>
                         *)var);
  local_330 = (int *)Catch::Decomposer::operator<=
                               ((Decomposer *)((long)&catchAssertionHandler_5.m_resultCapture + 7),
                                lhs);
  Catch::ExprLhs<int_const&>::operator==
            (&local_328,(ExprLhs<int_const&> *)&local_330,
             (int *)catchAssertionHandler.m_resultCapture);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_2c8,&local_328.super_ITransientExpression);
  Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr(&local_328);
  Catch::AssertionHandler::complete((AssertionHandler *)local_2c8);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2c8);
  local_390 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_3a0,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp"
             ,0x40);
  Catch::StringRef::StringRef(&local_3b0,"!var.optional_value(variant_type<nullvar_t>{})");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_380,&local_390,&local_3a0,local_3b0,Normal);
  type_safe::union_type<type_safe::nullvar_t>::union_type
            ((union_type<type_safe::nullvar_t> *)
             ((long)&catchAssertionHandler_6.m_resultCapture + 7));
  type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>::
  optional_value((basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *)
                 &local_3c0,var);
  bVar1 = type_safe::basic_optional::operator_cast_to_bool((basic_optional *)&local_3c0);
  local_3b1 = Catch::Decomposer::operator<=(&local_3b2,!bVar1);
  Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_380,&local_3b1);
  type_safe::
  basic_optional<type_safe::reference_optional_storage<const_type_safe::nullvar_t,_false>_>::
  ~basic_optional(&local_3c0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_380);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_380);
  local_420 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_430,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp"
             ,0x41);
  Catch::StringRef::StringRef
            (&local_440,"bool(var.optional_value(variant_type<int>{})) == is_int::value");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_410,&local_420,&local_430,local_440,Normal);
  type_safe::union_type<int>::union_type
            ((union_type<int> *)((long)&catchAssertionHandler_7.m_resultCapture + 7));
  type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>::
  optional_value<int>((basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>
                       *)&local_478,var);
  bVar1 = type_safe::basic_optional::operator_cast_to_bool((basic_optional *)&local_478);
  local_469 = Catch::Decomposer::operator<=(&local_46a,bVar1);
  Catch::ExprLhs<bool>::operator==(&local_468,&local_469,true);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_410,&local_468.super_ITransientExpression);
  Catch::BinaryExpr<bool,_bool>::~BinaryExpr(&local_468);
  type_safe::basic_optional<type_safe::reference_optional_storage<const_int,_false>_>::
  ~basic_optional(&local_478);
  Catch::AssertionHandler::complete((AssertionHandler *)local_410);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_410);
  local_4d8 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_4e8,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp"
             ,0x42);
  Catch::StringRef::StringRef
            (&local_4f8,"bool(var.optional_value(variant_type<double>{})) == is_double::value");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_4c8,&local_4d8,&local_4e8,local_4f8,Normal);
  type_safe::union_type<double>::union_type
            ((union_type<double> *)((long)&catchAssertionHandler_8.m_resultCapture + 7));
  type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>::
  optional_value<double>
            ((basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *)
             &local_530,var);
  bVar1 = type_safe::basic_optional::operator_cast_to_bool((basic_optional *)&local_530);
  local_521 = Catch::Decomposer::operator<=(&local_522,bVar1);
  Catch::ExprLhs<bool>::operator==(&local_520,&local_521,false);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_4c8,&local_520.super_ITransientExpression);
  Catch::BinaryExpr<bool,_bool>::~BinaryExpr(&local_520);
  type_safe::basic_optional<type_safe::reference_optional_storage<const_double,_false>_>::
  ~basic_optional(&local_530);
  Catch::AssertionHandler::complete((AssertionHandler *)local_4c8);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_4c8);
  local_590 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_5a0,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/variant.cpp"
             ,0x43);
  Catch::StringRef::StringRef
            (&local_5b0,"bool(var.optional_value(variant_type<debugger_type>{})) == is_dbg::value");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_580,&local_590,&local_5a0,local_5b0,Normal);
  type_safe::union_type<debugger_type>::union_type(&local_5e9);
  type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>::
  optional_value<debugger_type>
            ((basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *)
             &local_5e8,var);
  bVar1 = type_safe::basic_optional::operator_cast_to_bool((basic_optional *)&local_5e8);
  local_5d9 = Catch::Decomposer::operator<=(&local_5da,bVar1);
  Catch::ExprLhs<bool>::operator==(&local_5d8,&local_5d9,false);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_580,&local_5d8.super_ITransientExpression);
  Catch::BinaryExpr<bool,_bool>::~BinaryExpr(&local_5d8);
  type_safe::basic_optional<type_safe::reference_optional_storage<const_debugger_type,_false>_>::
  ~basic_optional(&local_5e8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_580);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_580);
  return;
}

Assistant:

void check_variant_value(const Variant& var, const T& val)
{
    // boolean queries
    REQUIRE(var.has_value());
    REQUIRE(var);

    // type queries
    REQUIRE(var.type() == typename Variant::type_id(variant_type<T>{}));
    REQUIRE(var.has_value(variant_type<T>{}));

    // value query
    REQUIRE(var.value(variant_type<T>{}) == val);

    // optional_value queries
    using is_int    = std::is_same<T, int>;
    using is_double = std::is_same<T, double>;
    using is_dbg    = std::is_same<T, debugger_type>;

    REQUIRE(!var.optional_value(variant_type<nullvar_t>{}));
    REQUIRE(bool(var.optional_value(variant_type<int>{})) == is_int::value);
    REQUIRE(bool(var.optional_value(variant_type<double>{})) == is_double::value);
    REQUIRE(bool(var.optional_value(variant_type<debugger_type>{})) == is_dbg::value);
}